

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void nighttime(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  tgestate_t *state_00;
  long in_RDI;
  int16_t row;
  int16_t column;
  uint8_t clip_left;
  searchlight_movement_t *slstate;
  attribute_t *attrs;
  int iters;
  uint8_t caught_x;
  uint8_t caught_y;
  uint8_t map_x;
  uint8_t map_y;
  attribute_t *in_stack_00000028;
  tgestate_t *in_stack_00000030;
  undefined2 in_stack_ffffffffffffffd8;
  short in_stack_ffffffffffffffda;
  short in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  int local_10;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  
  if (*(char *)(in_RDI + 0x693) == -1) {
    state_00 = (tgestate_t *)(in_RDI + 0x718);
    local_10 = 3;
    goto LAB_0010ac99;
  }
  if (*(char *)(in_RDI + 0x120) != '\0') {
    *(undefined1 *)(in_RDI + 0x693) = 0xff;
    return;
  }
  if (*(char *)(in_RDI + 0x693) == '\x1f') {
    bVar2 = *(char *)(in_RDI + 0x691) + 4;
    bVar1 = *(byte *)(in_RDI + 0x692);
    local_c = *(byte *)(in_RDI + 0x748);
    local_b = *(byte *)(in_RDI + 0x749);
    if (local_c == bVar2) {
      if (local_b == bVar1) {
        return;
      }
    }
    else if (local_c < bVar2) {
      local_c = local_c + 1;
    }
    else {
      local_c = local_c - 1;
    }
    if (local_b != bVar1) {
      if (local_b < bVar1) {
        local_b = local_b + 1;
      }
      else {
        local_b = local_b - 1;
      }
    }
    *(byte *)(in_RDI + 0x748) = local_c;
    *(byte *)(in_RDI + 0x749) = local_b;
  }
  local_a = *(byte *)(in_RDI + 0x691);
  local_9 = *(byte *)(in_RDI + 0x692);
  state_00 = (tgestate_t *)(in_RDI + 0x748);
  local_10 = 1;
  do {
    in_stack_ffffffffffffffdf = 0;
    in_stack_ffffffffffffffdc = (ushort)(byte)state_00->width - (ushort)local_a;
    if (in_stack_ffffffffffffffdc < 0) {
      in_stack_ffffffffffffffdf = 0xff;
    }
    in_stack_ffffffffffffffda = (ushort)*(byte *)((long)&state_00->width + 1) - (ushort)local_9;
    searchlight_plot(in_stack_00000030,in_stack_00000028,state._4_4_);
    do {
      state_00 = (tgestate_t *)&state_00->st_columns;
      local_10 = local_10 + -1;
      if (local_10 == 0) {
        return;
      }
LAB_0010ac99:
      searchlight_movement((searchlight_movement_t *)state_00);
      searchlight_caught(state_00,(searchlight_movement_t *)
                                  CONCAT17(in_stack_ffffffffffffffdf,
                                           CONCAT16(in_stack_ffffffffffffffde,
                                                    CONCAT24(in_stack_ffffffffffffffdc,
                                                             CONCAT22(in_stack_ffffffffffffffda,
                                                                      in_stack_ffffffffffffffd8)))))
      ;
      local_a = *(byte *)(in_RDI + 0x691);
      local_9 = *(byte *)(in_RDI + 0x692);
    } while (((((byte)state_00->width + 0x10 < (uint)local_a) ||
              ((int)((uint)local_a + *(int *)(in_RDI + 8)) <= (int)(uint)(byte)state_00->width)) ||
             (*(byte *)((long)&state_00->width + 1) + 0x10 < (uint)local_9)) ||
            ((int)((uint)local_9 + *(int *)(in_RDI + 0xc)) <=
             (int)(uint)*(byte *)((long)&state_00->width + 1)));
  } while( true );
}

Assistant:

void nighttime(tgestate_t *state)
{
  uint8_t                 map_y;     /* was D */
  uint8_t                 map_x;     /* was E */
  uint8_t                 caught_y;  /* was H */
  uint8_t                 caught_x;  /* was L */
  int                     iters;     /* was B */
  attribute_t            *attrs;     /* was BC */
  searchlight_movement_t *slstate;   /* was HL */
  uint8_t                 clip_left; /* was A */
  int16_t                 column;    /* was BC */
  int16_t                 row;       /* was HL */

  assert(state != NULL);

  if (state->searchlight_state != searchlight_STATE_SEARCHING)
  {
    /* Caught. */

    if (state->room_index > room_0_OUTDOORS)
    {
      /* If the hero goes indoors then the searchlight loses track. */
      state->searchlight_state = searchlight_STATE_SEARCHING;
      return;
    }

    /* Otherwise the hero is outdoors. */

    /* If the searchlight previously caught the hero then track him. */

    if (state->searchlight_state == searchlight_STATE_CAUGHT)
    {
      map_x    = state->map_position.x + 4;
      map_y    = state->map_position.y;
      caught_x = state->searchlight.caught_coord.x; // Conv: Reordered
      caught_y = state->searchlight.caught_coord.y;

      if (caught_x == map_x)
      {
        /* If the highlight doesn't need to move then quit. */
        if (caught_y == map_y)
          return;
      }
      else
      {
        /* Move the searchlight left/right to focus on the hero. */
        if (caught_x < map_x)
          caught_x++;
        else
          caught_x--;
      }

      /* Move searchlight up/down to focus on the hero. */
      if (caught_y != map_y)
      {
        if (caught_y < map_y)
          caught_y++;
        else
          caught_y--;
      }

      state->searchlight.caught_coord.x = caught_x; // Conv: Fused store split apart.
      state->searchlight.caught_coord.y = caught_y;
    }

    map_x = state->map_position.x;
    map_y = state->map_position.y;
    /* This casts caught_coord into a searchlight_movement_t knowing that
     * only the coord members will be accessed. */
    slstate = (searchlight_movement_t *) &state->searchlight.caught_coord;
    iters = 1; // 1 iteration
    // PUSH BC
    // PUSH HL
    goto middle_bit;
  }

  /* When not tracking the hero all three searchlights are cycled through. */

  slstate = &state->searchlight.states[0];
  iters = 3; // 3 iterations == three searchlights
  do
  {
    searchlight_movement(slstate);
    searchlight_caught(state, slstate);

    map_x = state->map_position.x; // in E
    map_y = state->map_position.y; // in D

    /* Would the searchlight intersect with the game window? */
    // Conv: Reordered into the expected series
    // first check is if the searchlight image is off the left hand side
    // second check is if the searchlight image is off the right hand side
    // etc.
    if (slstate->xy.x + 16 < map_x || slstate->xy.x >= map_x + state->columns ||
        slstate->xy.y + 16 < map_y || slstate->xy.y >= map_y + state->rows)
      goto next;

middle_bit:
    clip_left = 0; // flag // the light is clipped to the left side of the window

    // HL points to slstate->xy OR -> state->searchlight.caught_coord depending on how it's entered

    column = slstate->xy.x - map_x;
    if (column < 0) // partly off the left hand side of the window
      clip_left = ~clip_left; // toggle flag 0 -> 255

    row = slstate->xy.y - map_y;

    // FUTURE: To avoid undefined behaviour (row & column _can_ be out of
    // bounds) pass the row and column into searchlight_plot.

    attrs = &state->speccy->screen.attributes[0x46 + row * state->width + column]; // 0x46 = address of top-left game window attribute

    // Conv: clip_left turned from state variable into function parameter.
    searchlight_plot(state, attrs, clip_left); // DE turned into HL from EX above

next:
    // POP HL
    // POP BC
    slstate++;
  }
  while (--iters);
}